

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_setmetatable(lua_State *L)

{
  int iVar1;
  int t;
  lua_State *L_local;
  
  iVar1 = lua_type(L,2);
  luaL_checktype(L,1,5);
  if ((iVar1 != 0) && (iVar1 != 5)) {
    luaL_argerror(L,2,"nil or table expected");
  }
  iVar1 = luaL_getmetafield(L,1,"__metatable");
  if (iVar1 == 0) {
    lua_settop(L,2);
    lua_setmetatable(L,1);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error(L,"cannot change a protected metatable");
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_setmetatable (lua_State *L) {
  int t = lua_type(L, 2);
  luaL_checktype(L, 1, LUA_TTABLE);
  luaL_argcheck(L, t == LUA_TNIL || t == LUA_TTABLE, 2,
                    "nil or table expected");
  if (luaL_getmetafield(L, 1, "__metatable"))
    return luaL_error(L, "cannot change a protected metatable");
  lua_settop(L, 2);
  lua_setmetatable(L, 1);
  return 1;
}